

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void Cmd_pings(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int local_20;
  int i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    if ((playeringame[local_20] & 1U) != 0) {
      uVar1 = currrecvtime[local_20];
      uVar2 = lastrecvtime[local_20];
      pcVar3 = userinfo_t::GetName((userinfo_t *)((long)local_20 * 0x2a0 + 0x1ae70f8));
      Printf("% 4d %s\n",(ulong)(uVar1 - uVar2),pcVar3);
    }
  }
  return;
}

Assistant:

CCMD (pings)
{
	int i;
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i])
			Printf ("% 4d %s\n", currrecvtime[i] - lastrecvtime[i],
					players[i].userinfo.GetName());
}